

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O2

void __thiscall
yactfr::internal::TsdlParser::_addDtAlias(TsdlParser *this,string *name,PseudoDt *pseudoDt)

{
  TextLocation TStack_38;
  
  StrScanner::loc(&TStack_38,&this->_ss);
  _addDtAlias(this,name,pseudoDt,&TStack_38);
  return;
}

Assistant:

void TsdlParser::_addDtAlias(std::string&& name, const PseudoDt& pseudoDt)
{
    this->_addDtAlias(std::move(name), pseudoDt, _ss.loc());
}